

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

bool __thiscall
ON_Line::Rotate(ON_Line *this,double sin_angle,double cos_angle,ON_3dVector *axis,ON_3dPoint *center
               )

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool rc;
  bool bFixP1;
  bool bFixP0;
  undefined1 local_b0 [8];
  ON_Xform rot;
  ON_3dPoint *center_local;
  ON_3dVector *axis_local;
  double cos_angle_local;
  double sin_angle_local;
  ON_Line *this_local;
  
  rot.m_xform[3][3] = (double)center;
  ON_Xform::ON_Xform((ON_Xform *)local_b0);
  ON_Xform::Rotation((ON_Xform *)local_b0,sin_angle,cos_angle,*axis,*(ON_3dPoint *)rot.m_xform[3][3]
                    );
  bVar1 = ON_3dPoint::operator==(&this->from,(ON_3dPoint *)rot.m_xform[3][3]);
  bVar2 = ON_3dPoint::operator==(&this->to,(ON_3dPoint *)rot.m_xform[3][3]);
  bVar3 = Transform(this,(ON_Xform *)local_b0);
  if (bVar1) {
    (this->from).x = *(double *)rot.m_xform[3][3];
    (this->from).y = *(double *)((long)rot.m_xform[3][3] + 8);
    (this->from).z = *(double *)((long)rot.m_xform[3][3] + 0x10);
  }
  if (bVar2) {
    (this->to).x = *(double *)rot.m_xform[3][3];
    (this->to).y = *(double *)((long)rot.m_xform[3][3] + 8);
    (this->to).z = *(double *)((long)rot.m_xform[3][3] + 0x10);
  }
  return bVar3;
}

Assistant:

bool ON_Line::Rotate(
      double sin_angle,                  // sin(angle)
      double cos_angle,                  // cos(angle)
      const ON_3dVector& axis,  // axis of rotation
      const ON_3dPoint& center  // center of rotation
      )
{
  ON_Xform rot;
  rot.Rotation( sin_angle, cos_angle, axis, center );
  const bool bFixP0 = (from==center);
  const bool bFixP1 = (to==center);
  const bool rc = Transform( rot );
  if ( bFixP0 )
    from = center;
  if ( bFixP1 )
    to = center;
  return rc;
}